

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplace_back<slang::ast::Expression_const&>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,Expression *args)

{
  undefined8 *puVar1;
  size_type sVar2;
  ulong uVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  pointer paVar6;
  undefined4 uVar7;
  pointer pAVar8;
  pointer pAVar9;
  pointer pAVar10;
  pointer pAVar11;
  long lVar12;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar13;
  pointer pAVar14;
  
  pAVar14 = this->data_ + this->len;
  if (this->len != this->cap) {
    pAVar14->expr = args;
    pAVar14->condition = (Expression *)0x0;
    pAVar14->edge = None;
    (pAVar14->edgeDescriptors)._M_ptr = (pointer)0x0;
    (pAVar14->edgeDescriptors)._M_extent._M_extent_value = 0;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  pEVar13 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar13 < ctx) {
    pEVar13 = ctx;
  }
  if (0x333333333333333 - uVar3 < uVar3) {
    pEVar13 = (EVP_PKEY_CTX *)0x333333333333333;
  }
  lVar12 = (long)pAVar14 - (long)this->data_;
  pAVar8 = (pointer)operator_new((long)pEVar13 * 0x28);
  *(Expression **)((long)pAVar8 + lVar12) = args;
  *(undefined8 *)((long)pAVar8 + lVar12 + 8) = 0;
  *(undefined4 *)((long)pAVar8 + lVar12 + 0x10) = 0;
  puVar1 = (undefined8 *)((long)pAVar8 + lVar12 + 0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  pAVar11 = this->data_;
  pAVar9 = pAVar11 + this->len;
  pAVar10 = pAVar8;
  if (pAVar9 == pAVar14) {
    for (; pAVar11 != pAVar14; pAVar11 = pAVar11 + 1) {
      (pAVar10->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar11->edgeDescriptors)._M_extent._M_extent_value;
      pEVar4 = pAVar11->expr;
      pEVar5 = pAVar11->condition;
      uVar7 = *(undefined4 *)&pAVar11->field_0x14;
      paVar6 = (pAVar11->edgeDescriptors)._M_ptr;
      pAVar10->edge = pAVar11->edge;
      *(undefined4 *)&pAVar10->field_0x14 = uVar7;
      (pAVar10->edgeDescriptors)._M_ptr = paVar6;
      pAVar10->expr = pEVar4;
      pAVar10->condition = pEVar5;
      pAVar10 = pAVar10 + 1;
    }
  }
  else {
    for (; pAVar11 != pAVar14; pAVar11 = pAVar11 + 1) {
      ctx = (EVP_PKEY_CTX *)(pAVar11->edgeDescriptors)._M_extent._M_extent_value;
      (pAVar10->edgeDescriptors)._M_extent._M_extent_value = (size_t)ctx;
      pEVar4 = pAVar11->expr;
      pEVar5 = pAVar11->condition;
      uVar7 = *(undefined4 *)&pAVar11->field_0x14;
      paVar6 = (pAVar11->edgeDescriptors)._M_ptr;
      pAVar10->edge = pAVar11->edge;
      *(undefined4 *)&pAVar10->field_0x14 = uVar7;
      (pAVar10->edgeDescriptors)._M_ptr = paVar6;
      pAVar10->expr = pEVar4;
      pAVar10->condition = pEVar5;
      pAVar10 = pAVar10 + 1;
    }
    puVar1 = (undefined8 *)((long)pAVar8 + lVar12);
    for (; pAVar14 != pAVar9; pAVar14 = pAVar14 + 1) {
      puVar1[9] = (pAVar14->edgeDescriptors)._M_extent._M_extent_value;
      pEVar4 = pAVar14->expr;
      pEVar5 = pAVar14->condition;
      paVar6 = (pAVar14->edgeDescriptors)._M_ptr;
      puVar1[7] = *(undefined8 *)&pAVar14->edge;
      puVar1[8] = paVar6;
      puVar1[5] = pEVar4;
      puVar1[6] = pEVar5;
      puVar1 = puVar1 + 5;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar13;
  this->data_ = pAVar8;
  return (reference)((long)pAVar8 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }